

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

int __thiscall
duckdb_re2::Regexp::Walker<int>::WalkInternal
          (Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<int>,_std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  int iVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  _Elt_pointer pWVar5;
  int *piVar6;
  Regexp *pRVar7;
  ulong uVar8;
  bool stop;
  undefined1 local_1b0 [8];
  int iStack_1a8;
  int iStack_1a4;
  int local_1a0;
  int iStack_19c;
  int *piStack_198;
  ios_base local_138 [264];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this_00 = &this->stack_;
    iStack_1a8 = -1;
    piStack_198 = (int *)0x0;
    pWVar5 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_1b0 = (undefined1  [8])re;
    iStack_1a4 = top_arg;
    if (pWVar5 == (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
      _M_push_back_aux<duckdb_re2::WalkState<int>>
                ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>> *)
                 this_00,(WalkState<int> *)local_1b0);
    }
    else {
      pWVar5->pre_arg = local_1a0;
      pWVar5->child_arg = iStack_19c;
      pWVar5->child_args = (int *)0x0;
      pWVar5->re = re;
      pWVar5->n = 0xffffffff;
      pWVar5->parent_arg = top_arg;
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
LAB_0048334a:
    while( true ) {
      pWVar5 = (this->stack_).c.
               super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar5 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar5 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar7 = pWVar5[-1].re;
      uVar8 = (ulong)(uint)pWVar5[-1].n;
      if (pWVar5[-1].n == 0xffffffff) break;
LAB_0048336d:
      uVar2 = pRVar7->nsub_;
      if (uVar2 == 0) {
LAB_00483443:
        top_arg = (*this->_vptr_Walker[3])
                            (this,pRVar7,(ulong)(uint)pWVar5[-1].parent_arg,
                             (ulong)(uint)pWVar5[-1].pre_arg,pWVar5[-1].child_args);
        if ((1 < pRVar7->nsub_) && (pWVar5[-1].child_args != (int *)0x0)) {
          operator_delete__(pWVar5[-1].child_args);
        }
        goto LAB_00483489;
      }
      if (uVar2 == 1) {
        paVar4 = &pRVar7->field_5;
      }
      else {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar7->field_5).submany_;
      }
      iVar3 = (int)uVar8;
      if ((int)(uint)uVar2 <= iVar3) goto LAB_00483443;
      if (use_copy && 0 < iVar3) {
        pRVar7 = (Regexp *)paVar4[uVar8].submany_;
        if ((Regexp *)paVar4[iVar3 - 1U].submany_ != pRVar7) goto LAB_004834d8;
        iVar3 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar5[-1].child_args[iVar3 - 1U]);
        pWVar5[-1].child_args[pWVar5[-1].n] = iVar3;
        pWVar5[-1].n = pWVar5[-1].n + 1;
      }
      else {
        pRVar7 = (Regexp *)paVar4[iVar3].submany_;
LAB_004834d8:
        iStack_1a4 = pWVar5[-1].pre_arg;
        iStack_1a8 = -1;
        piStack_198 = (int *)0x0;
        pWVar5 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_1b0 = (undefined1  [8])pRVar7;
        if (pWVar5 == (this->stack_).c.
                      super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
          _M_push_back_aux<duckdb_re2::WalkState<int>>
                    ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>> *
                     )this_00,(WalkState<int> *)local_1b0);
        }
        else {
          pWVar5->pre_arg = local_1a0;
          pWVar5->child_arg = iStack_19c;
          pWVar5->child_args = (int *)0x0;
          pWVar5->re = pRVar7;
          pWVar5->n = 0xffffffff;
          pWVar5->parent_arg = iStack_1a4;
          piVar1 = &(this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
    }
    iVar3 = this->max_visits_;
    this->max_visits_ = iVar3 + -1;
    if (iVar3 < 1) {
      this->stopped_early_ = true;
      top_arg = (*this->_vptr_Walker[5])(this,pRVar7,(ulong)(uint)pWVar5[-1].parent_arg);
    }
    else {
      local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
      top_arg = (*this->_vptr_Walker[2])(this,pRVar7,(ulong)(uint)pWVar5[-1].parent_arg,local_1b0);
      pWVar5[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar5[-1].n = 0;
        pWVar5[-1].child_args = (int *)0x0;
        uVar2 = pRVar7->nsub_;
        uVar8 = (ulong)uVar2;
        if (uVar2 != 0) {
          if (uVar2 == 1) {
            pWVar5[-1].child_args = &pWVar5[-1].child_arg;
            uVar8 = 0;
          }
          else {
            piVar6 = (int *)operator_new__((ulong)uVar2 << 2);
            pWVar5[-1].child_args = piVar6;
            uVar8 = (ulong)(uint)pWVar5[-1].n;
          }
        }
        goto LAB_0048336d;
      }
    }
LAB_00483489:
    std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::pop_back
              (&this_00->c);
    pWVar5 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar5 != (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar5 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar5 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pWVar5[-1].child_args == (int *)0x0) {
        piVar6 = &pWVar5[-1].child_arg;
      }
      else {
        piVar6 = pWVar5[-1].child_args + pWVar5[-1].n;
      }
      *piVar6 = top_arg;
      pWVar5[-1].n = pWVar5[-1].n + 1;
      goto LAB_0048334a;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}